

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsTime helicsInputGetTime(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  HelicsTime HVar2;
  TimeRepresentation<count_time<9,_long>_> val;
  long local_10;
  
  pIVar1 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  if (pIVar1 == (InputObject *)0x0) {
    HVar2 = -1.785e+39;
  }
  else {
    helics::Input::getValue_impl<TimeRepresentation<count_time<9,long>>>(pIVar1->inputPtr,&local_10)
    ;
    HVar2 = (double)(local_10 % 1000000000) * 1e-09 + (double)(local_10 / 1000000000);
  }
  return HVar2;
}

Assistant:

HelicsTime helicsInputGetTime(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getValue<helics::Time>();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}